

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O2

void __thiscall duckdb::BaseSecret::SerializeBaseSecret(BaseSecret *this,Serializer *serializer)

{
  const_reference pvVar1;
  idx_t i;
  size_type __n;
  size_type sVar2;
  
  Serializer::WriteProperty<std::__cxx11::string>(serializer,100,"type",&this->type);
  Serializer::WriteProperty<std::__cxx11::string>(serializer,0x65,"provider",&this->provider);
  Serializer::WriteProperty<std::__cxx11::string>(serializer,0x66,"name",&this->name);
  sVar2 = (long)(this->prefix_paths).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->prefix_paths).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  (*serializer->_vptr_Serializer[2])(serializer,0x67,"scope");
  (*serializer->_vptr_Serializer[8])(serializer,sVar2);
  for (__n = 0; sVar2 != __n; __n = __n + 1) {
    pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&this->prefix_paths,__n);
    (*serializer->_vptr_Serializer[0x1c])(serializer,pvVar1);
  }
  (*serializer->_vptr_Serializer[9])(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void BaseSecret::SerializeBaseSecret(Serializer &serializer) const {
	serializer.WriteProperty(100, "type", type);
	serializer.WriteProperty(101, "provider", provider);
	serializer.WriteProperty(102, "name", name);
	serializer.WriteList(103, "scope", prefix_paths.size(),
	                     [&](Serializer::List &list, idx_t i) { list.WriteElement(prefix_paths[i]); });
}